

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

int uv__spawn_and_init_child_fork
              (uv_process_options_t *options,int *error_fd,int stdio_count,int (*pipes) [2],
              pid_t *pid)

{
  int iVar1;
  __pid_t _Var2;
  int *piVar3;
  undefined1 local_138 [8];
  sigset_t sigoldset;
  sigset_t signewset;
  pid_t *pid_local;
  int (*pipes_local) [2];
  int stdio_count_local;
  int *error_fd_local;
  uv_process_options_t *options_local;
  
  sigfillset((sigset_t *)(sigoldset.__val + 0xf));
  sigdelset((sigset_t *)(sigoldset.__val + 0xf),9);
  sigdelset((sigset_t *)(sigoldset.__val + 0xf),0x13);
  sigdelset((sigset_t *)(sigoldset.__val + 0xf),5);
  sigdelset((sigset_t *)(sigoldset.__val + 0xf),0xb);
  sigdelset((sigset_t *)(sigoldset.__val + 0xf),7);
  sigdelset((sigset_t *)(sigoldset.__val + 0xf),4);
  sigdelset((sigset_t *)(sigoldset.__val + 0xf),0x1f);
  sigdelset((sigset_t *)(sigoldset.__val + 0xf),6);
  iVar1 = pthread_sigmask(0,(__sigset_t *)(sigoldset.__val + 0xf),(__sigset_t *)local_138);
  if (iVar1 != 0) {
    abort();
  }
  _Var2 = vfork();
  *pid = _Var2;
  if (*pid == 0) {
    uv__process_child_init(options,error_fd,stdio_count,pipes);
    abort();
  }
  iVar1 = pthread_sigmask(2,(__sigset_t *)local_138,(__sigset_t *)0x0);
  if (iVar1 != 0) {
    abort();
  }
  if (*pid == -1) {
    piVar3 = __errno_location();
    options_local._4_4_ = -*piVar3;
  }
  else {
    options_local._4_4_ = 0;
  }
  return options_local._4_4_;
}

Assistant:

static int uv__spawn_and_init_child_fork(const uv_process_options_t* options,
#ifdef __linux__
                                         volatile int* error_fd,
#else
                                         int error_fd,
#endif
                                         int stdio_count,
                                         int (*pipes)[2],
                                         pid_t* pid) {
  sigset_t signewset;
  sigset_t sigoldset;

  /* Start the child with most signals blocked, to avoid any issues before we
   * can reset them, but allow program failures to exit (and not hang). */
  sigfillset(&signewset);
  sigdelset(&signewset, SIGKILL);
  sigdelset(&signewset, SIGSTOP);
  sigdelset(&signewset, SIGTRAP);
  sigdelset(&signewset, SIGSEGV);
  sigdelset(&signewset, SIGBUS);
  sigdelset(&signewset, SIGILL);
  sigdelset(&signewset, SIGSYS);
  sigdelset(&signewset, SIGABRT);
  if (pthread_sigmask(SIG_BLOCK, &signewset, &sigoldset) != 0)
    abort();

#ifdef __linux__
  *pid = vfork();
#else
  *pid = fork();
#endif

  if (*pid == 0) {
    /* Fork succeeded, in the child process */
    /* After vfork, this shares memory (notably stack) with the parent. The
     * parent is paused until we exec or _exit. */
    uv__process_child_init(options, error_fd, stdio_count, pipes);
    abort();
  }

  if (pthread_sigmask(SIG_SETMASK, &sigoldset, NULL) != 0)
    abort();

  if (*pid == -1)
    /* Failed to fork */
    return UV__ERR(errno);

  /* Fork succeeded, in the parent process */
  return 0;
}